

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntNoDamping
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  void *pvVar56;
  undefined8 *puVar57;
  double *pdVar58;
  ulong uVar59;
  char *pcVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  undefined1 auVar78 [32];
  double dVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  double local_e60;
  Scalar local_e28;
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [16];
  double dStack_db0;
  double dStack_da8;
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  double local_c20;
  double dStack_c18;
  double dStack_c10;
  double dStack_c08;
  double local_c00;
  double dStack_bf8;
  double dStack_bf0;
  double dStack_be8;
  double local_be0;
  double dStack_bd8;
  double dStack_bd0;
  double dStack_bc8;
  double local_bc0;
  double dStack_bb8;
  double dStack_bb0;
  double dStack_ba8;
  double local_ba0;
  double dStack_b98;
  double dStack_b90;
  double dStack_b88;
  double local_b80;
  double dStack_b78;
  double dStack_b70;
  double dStack_b68;
  double local_b60;
  double dStack_b58;
  double dStack_b50;
  double dStack_b48;
  double local_b40;
  double dStack_b38;
  double dStack_b30;
  double dStack_b28;
  double local_b20;
  double dStack_b18;
  double dStack_b10;
  double dStack_b08;
  double local_b00;
  double dStack_af8;
  double dStack_af0;
  double dStack_ae8;
  double local_ae0;
  double dStack_ad8;
  double dStack_ad0;
  double dStack_ac8;
  double local_ac0;
  double dStack_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double local_aa0;
  double dStack_a98;
  double dStack_a90;
  double dStack_a88;
  undefined1 local_a70 [96];
  undefined1 local_a10 [32];
  undefined1 local_9f0 [32];
  undefined1 local_9d0 [32];
  undefined1 local_9b0 [32];
  undefined1 local_990 [32];
  undefined1 local_970 [32];
  double local_950;
  double dStack_948;
  double local_940;
  double local_938;
  double dStack_930;
  double local_928;
  double local_920;
  double dStack_918;
  double local_910;
  double local_908;
  double dStack_900;
  double dStack_8f8;
  double dStack_8f0;
  undefined1 local_8e8 [32];
  undefined1 local_8c8 [32];
  undefined1 local_8a8 [32];
  undefined1 local_888 [32];
  undefined1 local_868 [32];
  undefined1 local_848 [32];
  undefined1 local_828 [32];
  undefined1 local_808 [32];
  double local_7e8;
  double dStack_7e0;
  double local_7d8;
  double local_7d0;
  double dStack_7c8;
  double local_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  undefined1 local_7a0 [32];
  double local_780;
  double dStack_778;
  double dStack_770;
  double dStack_768;
  double local_760;
  double dStack_758;
  double dStack_750;
  double dStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  double local_680;
  double dStack_678;
  double local_670;
  double local_668;
  double dStack_660;
  double local_658;
  double local_650;
  double dStack_648;
  double local_640;
  undefined1 local_638 [64];
  undefined1 local_5f8 [32];
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [32];
  undefined1 local_598 [32];
  double local_578;
  double dStack_570;
  double dStack_568;
  double dStack_560;
  double local_558;
  double dStack_550;
  double dStack_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  double dStack_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double local_500;
  double dStack_4f8;
  double local_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  undefined1 local_4d0 [32];
  undefined1 local_4b0 [32];
  undefined1 local_490 [32];
  undefined1 local_470 [32];
  undefined1 local_450 [32];
  undefined1 local_430 [32];
  double local_410;
  double dStack_408;
  double dStack_400;
  double dStack_3f8;
  double local_3f0;
  double dStack_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double local_3d0;
  double dStack_3c8;
  double dStack_3c0;
  double dStack_3b8;
  double local_3b0;
  double dStack_3a8;
  double local_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double local_380;
  double dStack_378;
  double local_370;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  double local_308;
  double dStack_300;
  double dStack_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double dStack_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double local_230;
  double dStack_228;
  double local_220;
  double local_218;
  double dStack_210;
  double local_208;
  Matrix<double,_8,_3,_1,_8,_3> local_200;
  Matrix3xN local_140;
  
  CalcCoordMatrix(this,&local_140);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 8) {
    pcVar60 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, 3, 8, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 8, 1>>, Option = 0]"
    ;
LAB_0072549e:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar60);
  }
  local_638._8_8_ = &local_140;
  local_638._0_8_ = &this->m_SD;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0x2d) {
    pcVar60 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 3, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 3, 0>]"
    ;
LAB_007254c0:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar60);
  }
  memset((Matrix<double,_45,_3,_0,_45,_3> *)local_a70,0,0x438);
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0] =
       1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,45,3,0,45,3>>
            ((Matrix<double,_45,_3,_0,_45,_3> *)local_a70,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_638,
             (Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_> *)(local_638 + 8),
             (Scalar *)&local_200);
  peVar5 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  uVar59 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  uVar7 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  if (-1 < (long)(uVar7 | uVar59)) {
    if ((uVar59 == 0xc) && (uVar7 == 1)) {
      local_ba0 = (double)local_a70._0_8_;
      dStack_b98 = (double)local_a70._8_8_;
      dStack_b90 = (double)local_a70._16_8_;
      dStack_b88 = (double)local_a70._24_8_;
      local_bc0 = (double)local_a70._32_8_;
      dStack_bb8 = (double)local_a70._40_8_;
      dStack_bb0 = (double)local_a70._48_8_;
      dStack_ba8 = (double)local_a70._56_8_;
      dVar10 = local_8e8._0_8_;
      dVar14 = local_8e8._8_8_;
      dVar25 = local_8e8._16_8_;
      dVar36 = local_8e8._24_8_;
      auVar62 = vmulpd_avx512vl(local_a70._64_32_,local_a70._64_32_);
      auVar63 = vmulpd_avx512vl(local_8c8,local_8c8);
      dVar47 = (peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
               .m_data.array[0] * 0.5;
      pauVar8 = (undefined1 (*) [32])
                (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar81._8_8_ = dVar47;
      auVar81._0_8_ = dVar47;
      auVar81._16_8_ = dVar47;
      auVar81._24_8_ = dVar47;
      auVar70 = *pauVar8;
      auVar71 = pauVar8[1];
      auVar72 = pauVar8[2];
      dVar101 = auVar70._0_8_;
      dVar102 = auVar70._8_8_;
      dVar103 = auVar70._16_8_;
      dVar104 = auVar70._24_8_;
      local_b80 = ((double)local_a70._0_8_ * (double)local_a70._0_8_ + local_908 * local_908 +
                   local_7a0._0_8_ * local_7a0._0_8_ + -1.0) * dVar101 * dVar47;
      dStack_b78 = ((double)local_a70._8_8_ * (double)local_a70._8_8_ + dStack_900 * dStack_900 +
                    local_7a0._8_8_ * local_7a0._8_8_ + -1.0) * dVar102 * dVar47;
      dStack_b70 = ((double)local_a70._16_8_ * (double)local_a70._16_8_ + dStack_8f8 * dStack_8f8 +
                    local_7a0._16_8_ * local_7a0._16_8_ + -1.0) * dVar103 * dVar47;
      dStack_b68 = ((double)local_a70._24_8_ * (double)local_a70._24_8_ + dStack_8f0 * dStack_8f0 +
                    local_7a0._24_8_ * local_7a0._24_8_ + -1.0) * dVar104 * dVar47;
      auVar64 = vmulpd_avx512vl(auVar81,auVar71);
      local_b60 = ((double)local_a70._32_8_ * (double)local_a70._32_8_ + dVar10 * dVar10 +
                   local_780 * local_780 + -1.0) * auVar64._0_8_;
      dStack_b58 = ((double)local_a70._40_8_ * (double)local_a70._40_8_ + dVar14 * dVar14 +
                    dStack_778 * dStack_778 + -1.0) * auVar64._8_8_;
      dStack_b50 = ((double)local_a70._48_8_ * (double)local_a70._48_8_ + dVar25 * dVar25 +
                    dStack_770 * dStack_770 + -1.0) * auVar64._16_8_;
      dStack_b48 = ((double)local_a70._56_8_ * (double)local_a70._56_8_ + dVar36 * dVar36 +
                    dStack_768 * dStack_768 + -1.0) * auVar64._24_8_;
      auVar64 = vmulpd_avx512vl(auVar81,auVar72);
      local_b40 = (auVar62._0_8_ + auVar63._0_8_ + local_760 * local_760 + -1.0) * auVar64._0_8_;
      dStack_b38 = (auVar62._8_8_ + auVar63._8_8_ + dStack_758 * dStack_758 + -1.0) * auVar64._8_8_;
      dStack_b30 = (auVar62._16_8_ + auVar63._16_8_ + dStack_750 * dStack_750 + -1.0) *
                   auVar64._16_8_;
      dStack_b28 = (auVar62._24_8_ + auVar63._24_8_ + dStack_748 * dStack_748 + -1.0) *
                   auVar64._24_8_;
      dVar95 = local_a10._0_8_;
      dVar15 = local_a10._8_8_;
      dVar26 = local_a10._16_8_;
      dVar37 = local_a10._24_8_;
      dVar96 = local_8a8._0_8_;
      dVar16 = local_8a8._8_8_;
      dVar27 = local_8a8._16_8_;
      dVar38 = local_8a8._24_8_;
      dVar11 = local_9f0._0_8_;
      dVar17 = local_9f0._8_8_;
      dVar28 = local_9f0._16_8_;
      dVar39 = local_9f0._24_8_;
      dVar12 = local_720._0_8_;
      dVar18 = local_720._8_8_;
      dVar29 = local_720._16_8_;
      dVar40 = local_720._24_8_;
      auVar62 = vmulpd_avx512vl(local_9d0,local_9d0);
      dVar97 = local_700._0_8_;
      dVar19 = local_700._8_8_;
      dVar30 = local_700._16_8_;
      dVar41 = local_700._24_8_;
      dVar47 = *(double *)
                ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array + 8) * 0.5;
      auVar84._8_8_ = dVar47;
      auVar84._0_8_ = dVar47;
      auVar84._16_8_ = dVar47;
      auVar84._24_8_ = dVar47;
      local_b20 = dVar101 * dVar47 *
                  (dVar95 * dVar95 + dVar96 * dVar96 + local_740._0_8_ * local_740._0_8_ + -1.0);
      dStack_b18 = dVar102 * dVar47 *
                   (dVar15 * dVar15 + dVar16 * dVar16 + local_740._8_8_ * local_740._8_8_ + -1.0);
      dStack_b10 = dVar103 * dVar47 *
                   (dVar26 * dVar26 + dVar27 * dVar27 + local_740._16_8_ * local_740._16_8_ + -1.0);
      dStack_b08 = dVar104 * dVar47 *
                   (dVar37 * dVar37 + dVar38 * dVar38 + local_740._24_8_ * local_740._24_8_ + -1.0);
      auVar63 = vmulpd_avx512vl(auVar71,auVar84);
      local_b00 = (dVar11 * dVar11 + local_888._0_8_ * local_888._0_8_ + dVar12 * dVar12 + -1.0) *
                  auVar63._0_8_;
      dStack_af8 = (dVar17 * dVar17 + local_888._8_8_ * local_888._8_8_ + dVar18 * dVar18 + -1.0) *
                   auVar63._8_8_;
      dStack_af0 = (dVar28 * dVar28 + local_888._16_8_ * local_888._16_8_ + dVar29 * dVar29 + -1.0)
                   * auVar63._16_8_;
      dStack_ae8 = (dVar39 * dVar39 + local_888._24_8_ * local_888._24_8_ + dVar40 * dVar40 + -1.0)
                   * auVar63._24_8_;
      auVar63 = vmulpd_avx512vl(auVar72,auVar84);
      local_ae0 = (auVar62._0_8_ + local_868._0_8_ * local_868._0_8_ + dVar97 * dVar97 + -1.0) *
                  auVar63._0_8_;
      dStack_ad8 = (auVar62._8_8_ + local_868._8_8_ * local_868._8_8_ + dVar19 * dVar19 + -1.0) *
                   auVar63._8_8_;
      dStack_ad0 = (auVar62._16_8_ + local_868._16_8_ * local_868._16_8_ + dVar30 * dVar30 + -1.0) *
                   auVar63._16_8_;
      dStack_ac8 = (auVar62._24_8_ + local_868._24_8_ * local_868._24_8_ + dVar41 * dVar41 + -1.0) *
                   auVar63._24_8_;
      auVar62 = vmulpd_avx512vl(local_9b0,local_9b0);
      dVar98 = local_848._0_8_;
      dVar20 = local_848._8_8_;
      dVar31 = local_848._16_8_;
      dVar42 = local_848._24_8_;
      dVar99 = local_990._0_8_;
      dVar21 = local_990._8_8_;
      dVar32 = local_990._16_8_;
      dVar43 = local_990._24_8_;
      dVar100 = local_828._0_8_;
      dVar22 = local_828._8_8_;
      dVar33 = local_828._16_8_;
      dVar44 = local_828._24_8_;
      dVar79 = local_6c0._0_8_;
      dVar23 = local_6c0._8_8_;
      dVar34 = local_6c0._16_8_;
      dVar45 = local_6c0._24_8_;
      dVar13 = local_970._0_8_;
      dVar24 = local_970._8_8_;
      dVar35 = local_970._16_8_;
      dVar46 = local_970._24_8_;
      dVar47 = *(double *)
                ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array + 0x10) * 0.5;
      auVar82._8_8_ = dVar47;
      auVar82._0_8_ = dVar47;
      auVar82._16_8_ = dVar47;
      auVar82._24_8_ = dVar47;
      local_ac0 = (auVar62._0_8_ + dVar98 * dVar98 + local_6e0._0_8_ * local_6e0._0_8_ + -1.0) *
                  dVar101 * dVar47;
      dStack_ab8 = (auVar62._8_8_ + dVar20 * dVar20 + local_6e0._8_8_ * local_6e0._8_8_ + -1.0) *
                   dVar102 * dVar47;
      dStack_ab0 = (auVar62._16_8_ + dVar31 * dVar31 + local_6e0._16_8_ * local_6e0._16_8_ + -1.0) *
                   dVar103 * dVar47;
      dStack_aa8 = (auVar62._24_8_ + dVar42 * dVar42 + local_6e0._24_8_ * local_6e0._24_8_ + -1.0) *
                   dVar104 * dVar47;
      auVar62 = vmulpd_avx512vl(auVar71,auVar82);
      local_aa0 = (dVar99 * dVar99 + dVar100 * dVar100 + dVar79 * dVar79 + -1.0) * auVar62._0_8_;
      dStack_a98 = (dVar21 * dVar21 + dVar22 * dVar22 + dVar23 * dVar23 + -1.0) * auVar62._8_8_;
      dStack_a90 = (dVar32 * dVar32 + dVar33 * dVar33 + dVar34 * dVar34 + -1.0) * auVar62._16_8_;
      dStack_a88 = (dVar43 * dVar43 + dVar44 * dVar44 + dVar45 * dVar45 + -1.0) * auVar62._24_8_;
      auVar62 = vmulpd_avx512vl(auVar72,auVar82);
      dVar74 = (dVar13 * dVar13 + local_808._0_8_ * local_808._0_8_ +
                local_6a0._0_8_ * local_6a0._0_8_ + -1.0) * auVar62._0_8_;
      dVar75 = (dVar24 * dVar24 + local_808._8_8_ * local_808._8_8_ +
                local_6a0._8_8_ * local_6a0._8_8_ + -1.0) * auVar62._8_8_;
      dVar76 = (dVar35 * dVar35 + local_808._16_8_ * local_808._16_8_ +
                local_6a0._16_8_ * local_6a0._16_8_ + -1.0) * auVar62._16_8_;
      dVar77 = (dVar46 * dVar46 + local_808._24_8_ * local_808._24_8_ +
                local_6a0._24_8_ * local_6a0._24_8_ + -1.0) * auVar62._24_8_;
      auVar62 = vmulpd_avx512vl(local_a10,local_9b0);
      auVar63 = vmulpd_avx512vl(local_8a8,local_848);
      local_c60 = local_6e0;
      local_d40 = local_740;
      auVar64 = vmulpd_avx512vl(local_740,local_6e0);
      auVar65 = vmulpd_avx512vl(local_9f0,local_990);
      auVar66 = vmulpd_avx512vl(local_888,local_828);
      local_c40 = local_6c0;
      local_d20 = local_720;
      auVar67 = vmulpd_avx512vl(local_9d0,local_970);
      auVar68 = vmulpd_avx512vl(local_868,local_808);
      local_ca0 = local_808;
      dVar47 = *(double *)
                ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array + 0x18);
      auVar85._8_8_ = dVar47;
      auVar85._0_8_ = dVar47;
      auVar85._16_8_ = dVar47;
      auVar85._24_8_ = dVar47;
      auVar69 = vmulpd_avx512vl(local_700,local_6a0);
      local_c80 = local_6a0;
      local_d60 = local_700;
      local_c20 = (auVar62._0_8_ + auVar63._0_8_ + auVar64._0_8_) * dVar101 * dVar47;
      dStack_c18 = (auVar62._8_8_ + auVar63._8_8_ + auVar64._8_8_) * dVar102 * dVar47;
      dStack_c10 = (auVar62._16_8_ + auVar63._16_8_ + auVar64._16_8_) * dVar103 * dVar47;
      dStack_c08 = (auVar62._24_8_ + auVar63._24_8_ + auVar64._24_8_) * dVar104 * dVar47;
      auVar62 = vmulpd_avx512vl(auVar71,auVar85);
      local_c00 = (auVar65._0_8_ + auVar66._0_8_ + dVar79 * dVar12) * auVar62._0_8_;
      dStack_bf8 = (auVar65._8_8_ + auVar66._8_8_ + dVar23 * dVar18) * auVar62._8_8_;
      dStack_bf0 = (auVar65._16_8_ + auVar66._16_8_ + dVar34 * dVar29) * auVar62._16_8_;
      dStack_be8 = (auVar65._24_8_ + auVar66._24_8_ + dVar45 * dVar40) * auVar62._24_8_;
      auVar62 = vmulpd_avx512vl(auVar72,auVar85);
      local_be0 = (auVar67._0_8_ + auVar68._0_8_ + auVar69._0_8_) * auVar62._0_8_;
      dStack_bd8 = (auVar67._8_8_ + auVar68._8_8_ + auVar69._8_8_) * auVar62._8_8_;
      dStack_bd0 = (auVar67._16_8_ + auVar68._16_8_ + auVar69._16_8_) * auVar62._16_8_;
      dStack_bc8 = (auVar67._24_8_ + auVar68._24_8_ + auVar69._24_8_) * auVar62._24_8_;
      auVar49._8_8_ = local_a70._8_8_;
      auVar49._0_8_ = local_a70._0_8_;
      auVar49._16_8_ = local_a70._16_8_;
      auVar49._24_8_ = local_a70._24_8_;
      auVar62._8_8_ = dStack_900;
      auVar62._0_8_ = local_908;
      auVar62._16_8_ = dStack_8f8;
      auVar62._24_8_ = dStack_8f0;
      local_d80 = local_7a0;
      auVar63 = vmulpd_avx512vl(local_7a0,local_6e0);
      auVar83._0_8_ = (double)local_a70._0_8_ * local_9b0._0_8_ + local_908 * dVar98 + auVar63._0_8_
      ;
      auVar83._8_8_ =
           (double)local_a70._8_8_ * local_9b0._8_8_ + dStack_900 * dVar20 + auVar63._8_8_;
      auVar83._16_8_ =
           (double)local_a70._16_8_ * local_9b0._16_8_ + dStack_8f8 * dVar31 + auVar63._16_8_;
      auVar83._24_8_ =
           (double)local_a70._24_8_ * local_9b0._24_8_ + dStack_8f0 * dVar42 + auVar63._24_8_;
      auVar69._8_8_ = local_a70._40_8_;
      auVar69._0_8_ = local_a70._32_8_;
      auVar69._16_8_ = local_a70._48_8_;
      auVar69._24_8_ = local_a70._56_8_;
      auVar64 = vmulpd_avx512vl(auVar69,local_990);
      auVar65 = vmulpd_avx512vl(local_8e8,local_828);
      auVar63._8_8_ = dStack_778;
      auVar63._0_8_ = local_780;
      auVar63._16_8_ = dStack_770;
      auVar63._24_8_ = dStack_768;
      auVar66 = vmulpd_avx512vl(auVar63,local_6c0);
      auVar80._0_8_ = auVar64._0_8_ + auVar65._0_8_ + auVar66._0_8_;
      auVar80._8_8_ = auVar64._8_8_ + auVar65._8_8_ + auVar66._8_8_;
      auVar80._16_8_ = auVar64._16_8_ + auVar65._16_8_ + auVar66._16_8_;
      auVar80._24_8_ = auVar64._24_8_ + auVar65._24_8_ + auVar66._24_8_;
      auVar64 = vmulpd_avx512vl(local_a70._64_32_,local_970);
      auVar65 = vmulpd_avx512vl(local_8c8,local_808);
      auVar65 = vaddpd_avx512vl(auVar64,auVar65);
      auVar61._8_8_ = 0;
      auVar61._0_8_ =
           *(double *)
            ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 0x20);
      auVar66 = vbroadcastsd_avx512vl(auVar61);
      auVar64._8_8_ = dStack_758;
      auVar64._0_8_ = local_760;
      auVar64._16_8_ = dStack_750;
      auVar64._24_8_ = dStack_748;
      auVar64 = vmulpd_avx512vl(auVar64,local_6a0);
      auVar64 = vaddpd_avx512vl(auVar65,auVar64);
      auVar65 = vmulpd_avx512vl(auVar70,auVar66);
      local_cc0 = vmulpd_avx512vl(auVar83,auVar65);
      auVar65 = vmulpd_avx512vl(auVar71,auVar66);
      local_d00 = vmulpd_avx512vl(auVar80,auVar65);
      auVar65 = vmulpd_avx512vl(auVar72,auVar66);
      local_ce0 = vmulpd_avx512vl(auVar64,auVar65);
      auVar64 = vmulpd_avx512vl(auVar49,local_a10);
      auVar65 = vmulpd_avx512vl(auVar62,local_8a8);
      auVar64 = vaddpd_avx512vl(auVar64,auVar65);
      auVar65 = vmulpd_avx512vl(local_7a0,local_740);
      auVar64 = vaddpd_avx512vl(auVar64,auVar65);
      auVar65 = vmulpd_avx512vl(auVar69,local_9f0);
      auVar66 = vmulpd_avx512vl(local_8e8,local_888);
      local_e20 = local_8e8;
      auVar65 = vaddpd_avx512vl(auVar65,auVar66);
      auVar63 = vmulpd_avx512vl(auVar63,local_720);
      auVar65 = vaddpd_avx512vl(auVar65,auVar63);
      auVar66 = vmulpd_avx512vl(local_a70._64_32_,local_9d0);
      local_de0 = local_a70._64_32_;
      local_e00 = local_868;
      auVar67 = vmulpd_avx512vl(local_8c8,local_868);
      _local_dc0 = local_8c8;
      auVar63 = _local_dc0;
      auVar66 = vaddpd_avx512vl(auVar66,auVar67);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(double *)
                      ((long)(peVar5->m_D0).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + 0x28);
      auVar67 = vbroadcastsd_avx512vl(auVar4);
      auVar87._0_8_ = dVar97 * local_760;
      auVar87._8_8_ = dVar19 * dStack_758;
      auVar87._16_8_ = dVar30 * dStack_750;
      auVar87._24_8_ = dVar41 * dStack_748;
      auVar66 = vaddpd_avx512vl(auVar66,auVar87);
      auVar70 = vmulpd_avx512vl(auVar70,auVar67);
      auVar86._0_8_ = auVar64._0_8_ * auVar70._0_8_;
      auVar86._8_8_ = auVar64._8_8_ * auVar70._8_8_;
      auVar86._16_8_ = auVar64._16_8_ * auVar70._16_8_;
      auVar86._24_8_ = auVar64._24_8_ * auVar70._24_8_;
      auVar70 = vmulpd_avx512vl(auVar71,auVar67);
      auVar64 = vmulpd_avx512vl(auVar65,auVar70);
      auVar70 = vmulpd_avx512vl(auVar72,auVar67);
      auVar78._0_8_ = auVar66._0_8_ * auVar70._0_8_;
      auVar78._8_8_ = auVar66._8_8_ * auVar70._8_8_;
      auVar78._16_8_ = auVar66._16_8_ * auVar70._16_8_;
      auVar78._24_8_ = auVar66._24_8_ * auVar70._24_8_;
      auVar73._8_8_ = dStack_b78;
      auVar73._0_8_ = local_b80;
      auVar73._16_8_ = dStack_b70;
      auVar73._24_8_ = dStack_b68;
      auVar88._0_8_ = (double)local_a70._0_8_ * local_b80;
      auVar88._8_8_ = (double)local_a70._8_8_ * dStack_b78;
      auVar88._16_8_ = (double)local_a70._16_8_ * dStack_b70;
      auVar88._24_8_ = (double)local_a70._24_8_ * dStack_b68;
      auVar70 = vmulpd_avx512vl(local_a10,auVar86);
      auVar70 = vaddpd_avx512vl(auVar88,auVar70);
      auVar71 = vmulpd_avx512vl(local_9b0,local_cc0);
      local_638._0_32_ = vaddpd_avx512vl(auVar71,auVar70);
      auVar50._8_8_ = dStack_b58;
      auVar50._0_8_ = local_b60;
      auVar50._16_8_ = dStack_b50;
      auVar50._24_8_ = dStack_b48;
      auVar89._0_8_ = (double)local_a70._32_8_ * local_b60;
      auVar89._8_8_ = (double)local_a70._40_8_ * dStack_b58;
      auVar89._16_8_ = (double)local_a70._48_8_ * dStack_b50;
      auVar89._24_8_ = (double)local_a70._56_8_ * dStack_b48;
      auVar70 = vmulpd_avx512vl(local_9f0,auVar64);
      local_da0 = local_9f0;
      auVar70 = vaddpd_avx512vl(auVar89,auVar70);
      auVar71 = vmulpd_avx512vl(local_990,local_d00);
      local_638._32_32_ = vaddpd_avx512vl(auVar71,auVar70);
      auVar51._8_8_ = dStack_b38;
      auVar51._0_8_ = local_b40;
      auVar51._16_8_ = dStack_b30;
      auVar51._24_8_ = dStack_b28;
      auVar90._0_8_ = local_a70._64_8_ * local_b40;
      auVar90._8_8_ = local_a70._72_8_ * dStack_b38;
      auVar90._16_8_ = local_a70._80_8_ * dStack_b30;
      auVar90._24_8_ = local_a70._88_8_ * dStack_b28;
      auVar70 = vmulpd_avx512vl(local_9d0,auVar78);
      auVar70 = vaddpd_avx512vl(auVar90,auVar70);
      auVar71 = vmulpd_avx512vl(local_970,local_ce0);
      local_5f8 = vaddpd_avx512vl(auVar71,auVar70);
      auVar70 = vmulpd_avx512vl(auVar62,auVar73);
      auVar71 = vmulpd_avx512vl(local_8a8,auVar86);
      auVar70 = vaddpd_avx512vl(auVar70,auVar71);
      auVar71 = vmulpd_avx512vl(local_848,local_cc0);
      local_4d0 = vaddpd_avx512vl(auVar71,auVar70);
      auVar91._0_8_ = dVar10 * local_b60;
      auVar91._8_8_ = dVar14 * dStack_b58;
      auVar91._16_8_ = dVar25 * dStack_b50;
      auVar91._24_8_ = dVar36 * dStack_b48;
      auVar70 = vmulpd_avx512vl(local_888,auVar64);
      auVar70 = vaddpd_avx512vl(auVar91,auVar70);
      auVar71 = vmulpd_avx512vl(local_828,local_d00);
      local_4b0 = vaddpd_avx512vl(auVar71,auVar70);
      auVar70 = vmulpd_avx512vl(local_8c8,auVar51);
      auVar71 = vmulpd_avx512vl(local_868,auVar78);
      auVar70 = vaddpd_avx512vl(auVar70,auVar71);
      auVar71 = vmulpd_avx512vl(local_808,local_ce0);
      local_490 = vaddpd_avx512vl(auVar71,auVar70);
      auVar70 = vmulpd_avx512vl(local_7a0,auVar73);
      auVar71 = vmulpd_avx512vl(local_740,auVar86);
      auVar70 = vaddpd_avx512vl(auVar70,auVar71);
      auVar71 = vmulpd_avx512vl(local_6e0,local_cc0);
      local_368 = vaddpd_avx512vl(auVar71,auVar70);
      auVar71._8_8_ = dStack_778;
      auVar71._0_8_ = local_780;
      auVar71._16_8_ = dStack_770;
      auVar71._24_8_ = dStack_768;
      auVar70 = vmulpd_avx512vl(auVar71,auVar50);
      auVar72 = vmulpd_avx512vl(local_720,auVar64);
      auVar70 = vaddpd_avx512vl(auVar70,auVar72);
      auVar72 = vmulpd_avx512vl(local_6c0,local_d00);
      local_348 = vaddpd_avx512vl(auVar72,auVar70);
      auVar72._8_8_ = dStack_758;
      auVar72._0_8_ = local_760;
      auVar72._16_8_ = dStack_750;
      auVar72._24_8_ = dStack_748;
      auVar70 = vmulpd_avx512vl(auVar72,auVar51);
      auVar62 = vmulpd_avx512vl(local_700,auVar78);
      auVar70 = vaddpd_avx512vl(auVar70,auVar62);
      auVar62 = vmulpd_avx512vl(local_6a0,local_ce0);
      local_328 = vaddpd_avx512vl(auVar62,auVar70);
      auVar92._0_8_ = (double)local_a70._0_8_ * auVar86._0_8_;
      auVar92._8_8_ = (double)local_a70._8_8_ * auVar86._8_8_;
      auVar92._16_8_ = (double)local_a70._16_8_ * auVar86._16_8_;
      auVar92._24_8_ = (double)local_a70._24_8_ * auVar86._24_8_;
      auVar52._8_8_ = dStack_b18;
      auVar52._0_8_ = local_b20;
      auVar52._16_8_ = dStack_b10;
      auVar52._24_8_ = dStack_b08;
      auVar70 = vmulpd_avx512vl(local_a10,auVar52);
      auVar70 = vaddpd_avx512vl(auVar70,auVar92);
      auVar66._8_8_ = dStack_c18;
      auVar66._0_8_ = local_c20;
      auVar66._16_8_ = dStack_c10;
      auVar66._24_8_ = dStack_c08;
      auVar62 = vmulpd_avx512vl(local_9b0,auVar66);
      local_5d8 = vaddpd_avx512vl(auVar62,auVar70);
      auVar93._0_8_ = auVar64._0_8_ * (double)local_a70._32_8_;
      auVar93._8_8_ = auVar64._8_8_ * (double)local_a70._40_8_;
      auVar93._16_8_ = auVar64._16_8_ * (double)local_a70._48_8_;
      auVar93._24_8_ = auVar64._24_8_ * (double)local_a70._56_8_;
      auVar53._8_8_ = dStack_af8;
      auVar53._0_8_ = local_b00;
      auVar53._16_8_ = dStack_af0;
      auVar53._24_8_ = dStack_ae8;
      auVar70 = vmulpd_avx512vl(local_9f0,auVar53);
      auVar70 = vaddpd_avx512vl(auVar70,auVar93);
      auVar67._8_8_ = dStack_bf8;
      auVar67._0_8_ = local_c00;
      auVar67._16_8_ = dStack_bf0;
      auVar67._24_8_ = dStack_be8;
      auVar62 = vmulpd_avx512vl(local_990,auVar67);
      local_5b8 = vaddpd_avx512vl(auVar62,auVar70);
      auVar70 = vmulpd_avx512vl(local_a70._64_32_,auVar78);
      auVar54._8_8_ = dStack_ad8;
      auVar54._0_8_ = local_ae0;
      auVar54._16_8_ = dStack_ad0;
      auVar54._24_8_ = dStack_ac8;
      auVar62 = vmulpd_avx512vl(local_9d0,auVar54);
      auVar70 = vaddpd_avx512vl(auVar62,auVar70);
      auVar68._8_8_ = dStack_bd8;
      auVar68._0_8_ = local_be0;
      auVar68._16_8_ = dStack_bd0;
      auVar68._24_8_ = dStack_bc8;
      auVar62 = vmulpd_avx512vl(local_970,auVar68);
      local_598 = vaddpd_avx512vl(auVar62,auVar70);
      auVar70._8_8_ = dStack_900;
      auVar70._0_8_ = local_908;
      auVar70._16_8_ = dStack_8f8;
      auVar70._24_8_ = dStack_8f0;
      auVar62 = vmulpd_avx512vl(auVar70,auVar86);
      auVar65 = vmulpd_avx512vl(local_8a8,auVar52);
      auVar62 = vaddpd_avx512vl(auVar65,auVar62);
      auVar65 = vmulpd_avx512vl(local_848,auVar66);
      local_470 = vaddpd_avx512vl(auVar65,auVar62);
      auVar62 = vmulpd_avx512vl(local_8e8,auVar64);
      auVar65 = vmulpd_avx512vl(local_888,auVar53);
      auVar62 = vaddpd_avx512vl(auVar65,auVar62);
      auVar65 = vmulpd_avx512vl(local_828,auVar67);
      local_450 = vaddpd_avx512vl(auVar65,auVar62);
      local_dc0._0_8_ = local_8c8._0_8_;
      local_dc0._8_8_ = local_8c8._8_8_;
      dStack_db0 = local_8c8._16_8_;
      dStack_da8 = local_8c8._24_8_;
      auVar94._0_8_ = (double)local_dc0._0_8_ * auVar78._0_8_;
      auVar94._8_8_ = (double)local_dc0._8_8_ * auVar78._8_8_;
      auVar94._16_8_ = dStack_db0 * auVar78._16_8_;
      auVar94._24_8_ = dStack_da8 * auVar78._24_8_;
      auVar62 = vmulpd_avx512vl(local_868,auVar54);
      auVar62 = vaddpd_avx512vl(auVar62,auVar94);
      auVar65 = vmulpd_avx512vl(local_808,auVar68);
      local_430 = vaddpd_avx512vl(auVar65,auVar62);
      auVar62 = vmulpd_avx512vl(local_7a0,auVar86);
      auVar65 = vmulpd_avx512vl(local_740,auVar52);
      auVar73 = vmulpd_avx512vl(local_6e0,auVar66);
      local_308 = auVar73._0_8_ + auVar65._0_8_ + auVar62._0_8_;
      dStack_300 = auVar73._8_8_ + auVar65._8_8_ + auVar62._8_8_;
      dStack_2f8 = auVar73._16_8_ + auVar65._16_8_ + auVar62._16_8_;
      dStack_2f0 = auVar73._24_8_ + auVar65._24_8_ + auVar62._24_8_;
      auVar62 = vmulpd_avx512vl(auVar71,auVar64);
      auVar64 = vmulpd_avx512vl(local_6c0,auVar67);
      local_2e8 = auVar64._0_8_ + dVar12 * local_b00 + auVar62._0_8_;
      dStack_2e0 = auVar64._8_8_ + dVar18 * dStack_af8 + auVar62._8_8_;
      dStack_2d8 = auVar64._16_8_ + dVar29 * dStack_af0 + auVar62._16_8_;
      dStack_2d0 = auVar64._24_8_ + dVar40 * dStack_ae8 + auVar62._24_8_;
      auVar72 = vmulpd_avx512vl(auVar72,auVar78);
      auVar62 = vmulpd_avx512vl(local_6a0,auVar68);
      local_2c8 = auVar62._0_8_ + dVar97 * local_ae0 + auVar72._0_8_;
      dStack_2c0 = auVar62._8_8_ + dVar19 * dStack_ad8 + auVar72._8_8_;
      dStack_2b8 = auVar62._16_8_ + dVar30 * dStack_ad0 + auVar72._16_8_;
      dStack_2b0 = auVar62._24_8_ + dVar41 * dStack_ac8 + auVar72._24_8_;
      auVar72 = vmulpd_avx512vl(auVar49,local_cc0);
      auVar55._8_8_ = dStack_ab8;
      auVar55._0_8_ = local_ac0;
      auVar55._16_8_ = dStack_ab0;
      auVar55._24_8_ = dStack_aa8;
      local_578 = local_ac0 * local_9b0._0_8_ + local_c20 * dVar95 + auVar72._0_8_;
      dStack_570 = dStack_ab8 * local_9b0._8_8_ + dStack_c18 * dVar15 + auVar72._8_8_;
      dStack_568 = dStack_ab0 * local_9b0._16_8_ + dStack_c10 * dVar26 + auVar72._16_8_;
      dStack_560 = dStack_aa8 * local_9b0._24_8_ + dStack_c08 * dVar37 + auVar72._24_8_;
      auVar72 = vmulpd_avx512vl(auVar69,local_d00);
      local_558 = local_aa0 * dVar99 + local_c00 * dVar11 + auVar72._0_8_;
      dStack_550 = dStack_a98 * dVar21 + dStack_bf8 * dVar17 + auVar72._8_8_;
      dStack_548 = dStack_a90 * dVar32 + dStack_bf0 * dVar28 + auVar72._16_8_;
      dStack_540 = dStack_a88 * dVar43 + dStack_be8 * dVar39 + auVar72._24_8_;
      auVar72 = vmulpd_avx512vl(local_a70._64_32_,local_ce0);
      auVar62 = vmulpd_avx512vl(local_9d0,auVar68);
      auVar65._8_8_ = dVar75;
      auVar65._0_8_ = dVar74;
      auVar65._16_8_ = dVar76;
      auVar65._24_8_ = dVar77;
      local_538 = dVar74 * dVar13 + auVar62._0_8_ + auVar72._0_8_;
      dStack_530 = dVar75 * dVar24 + auVar62._8_8_ + auVar72._8_8_;
      dStack_528 = dVar76 * dVar35 + auVar62._16_8_ + auVar72._16_8_;
      dStack_520 = dVar77 * dVar46 + auVar62._24_8_ + auVar72._24_8_;
      auVar70 = vmulpd_avx512vl(auVar70,local_cc0);
      local_410 = local_ac0 * dVar98 + local_c20 * dVar96 + auVar70._0_8_;
      dStack_408 = dStack_ab8 * dVar20 + dStack_c18 * dVar16 + auVar70._8_8_;
      dStack_400 = dStack_ab0 * dVar31 + dStack_c10 * dVar27 + auVar70._16_8_;
      dStack_3f8 = dStack_aa8 * dVar42 + dStack_c08 * dVar38 + auVar70._24_8_;
      auVar70 = vmulpd_avx512vl(local_8e8,local_d00);
      auVar72 = vmulpd_avx512vl(local_888,auVar67);
      local_3f0 = local_aa0 * dVar100 + auVar72._0_8_ + auVar70._0_8_;
      dStack_3e8 = dStack_a98 * dVar22 + auVar72._8_8_ + auVar70._8_8_;
      dStack_3e0 = dStack_a90 * dVar33 + auVar72._16_8_ + auVar70._16_8_;
      dStack_3d8 = dStack_a88 * dVar44 + auVar72._24_8_ + auVar70._24_8_;
      auVar70 = vmulpd_avx512vl(local_868,auVar68);
      auVar72 = vmulpd_avx512vl(local_808,auVar65);
      local_3d0 = auVar72._0_8_ + auVar70._0_8_ + (double)local_dc0._0_8_ * local_ce0._0_8_;
      dStack_3c8 = auVar72._8_8_ + auVar70._8_8_ + (double)local_dc0._8_8_ * local_ce0._8_8_;
      dStack_3c0 = auVar72._16_8_ + auVar70._16_8_ + dStack_db0 * local_ce0._16_8_;
      dStack_3b8 = auVar72._24_8_ + auVar70._24_8_ + dStack_da8 * local_ce0._24_8_;
      auVar70 = vmulpd_avx512vl(local_7a0,local_cc0);
      auVar72 = vmulpd_avx512vl(local_740,auVar66);
      auVar62 = vmulpd_avx512vl(local_6e0,auVar55);
      local_2a8 = auVar62._0_8_ + auVar72._0_8_ + auVar70._0_8_;
      dStack_2a0 = auVar62._8_8_ + auVar72._8_8_ + auVar70._8_8_;
      dStack_298 = auVar62._16_8_ + auVar72._16_8_ + auVar70._16_8_;
      dStack_290 = auVar62._24_8_ + auVar72._24_8_ + auVar70._24_8_;
      auVar70 = vmulpd_avx512vl(auVar71,local_d00);
      local_288 = local_aa0 * dVar79 + dVar12 * local_c00 + auVar70._0_8_;
      dStack_280 = dStack_a98 * dVar23 + dVar18 * dStack_bf8 + auVar70._8_8_;
      dStack_278 = dStack_a90 * dVar34 + dVar29 * dStack_bf0 + auVar70._16_8_;
      dStack_270 = dStack_a88 * dVar45 + dVar40 * dStack_be8 + auVar70._24_8_;
      auVar70 = vmulpd_avx512vl(local_6a0,auVar65);
      local_268 = auVar70._0_8_ + dVar97 * local_be0 + local_760 * local_ce0._0_8_;
      dStack_260 = auVar70._8_8_ + dVar19 * dStack_bd8 + dStack_758 * local_ce0._8_8_;
      dStack_258 = auVar70._16_8_ + dVar30 * dStack_bd0 + dStack_750 * local_ce0._16_8_;
      dStack_250 = auVar70._24_8_ + dVar41 * dStack_bc8 + dStack_748 * local_ce0._24_8_;
      uVar59 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar7 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      _local_dc0 = auVar63;
      if ((long)(uVar7 | uVar59) < 0) goto LAB_00725400;
      if ((uVar59 == 3) && (uVar7 == 1)) {
        pauVar9 = (undefined1 (*) [16])
                  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        auVar2._8_8_ = 0x3fe0000000000000;
        auVar2._0_8_ = 0x3fe0000000000000;
        auVar61 = vmulpd_avx512vl(*pauVar9,auVar2);
        dVar47 = *(double *)pauVar9[1] * 0.5;
        peVar5 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var6 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        dVar95 = auVar61._0_8_;
        dVar97 = (local_950 * local_950 + local_7e8 * local_7e8 + local_680 * local_680 + -1.0) *
                 dVar95;
        dVar96 = auVar61._8_8_;
        dVar98 = (dStack_948 * dStack_948 + dStack_7e0 * dStack_7e0 + dStack_678 * dStack_678 + -1.0
                 ) * dVar96;
        dVar11 = (local_940 * local_940 + local_7d8 * local_7d8 + local_670 * local_670 + -1.0) *
                 dVar47;
        dVar99 = dVar95 * (local_938 * local_938 + local_7d0 * local_7d0 + local_668 * local_668 +
                          -1.0);
        dVar100 = dVar96 * (dStack_930 * dStack_930 + dStack_7c8 * dStack_7c8 +
                            dStack_660 * dStack_660 + -1.0);
        dVar12 = dVar47 * (local_928 * local_928 + local_7c0 * local_7c0 + local_658 * local_658 +
                          -1.0);
        dVar95 = dVar95 * (local_920 * local_920 + local_7b8 * local_7b8 + local_650 * local_650 +
                          -1.0);
        dVar96 = dVar96 * (dStack_918 * dStack_918 + dStack_7b0 * dStack_7b0 +
                           dStack_648 * dStack_648 + -1.0);
        dVar47 = dVar47 * (local_910 * local_910 + local_7a8 * local_7a8 + local_640 * local_640 +
                          -1.0);
        auVar61 = *(undefined1 (*) [16])
                   (peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                   m_storage.m_data.array;
        auVar4 = *(undefined1 (*) [16])
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x10);
        auVar2 = *(undefined1 (*) [16])
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x20);
        auVar3 = *(undefined1 (*) [16])
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x30);
        dVar10 = *(double *)
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x40);
        local_e60 = auVar61._0_8_;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        auVar48 = vshufpd_avx(auVar61,auVar61,1);
        auVar61 = vshufpd_avx(auVar61,auVar61,3);
        dVar79 = auVar4._0_8_;
        local_248 = dVar97 * local_e60 + dVar99 * auVar61._0_8_ + dVar95 * dVar79;
        dStack_240 = dVar98 * local_e60 + dVar100 * auVar61._8_8_ + dVar96 * dVar79;
        local_238 = dVar11 * local_e60 + dVar12 * auVar48._0_8_ + dVar47 * dVar79;
        auVar61 = vshufpd_avx(auVar4,auVar4,1);
        auVar48 = vshufpd_avx(auVar2,auVar2,1);
        auVar4 = vshufpd_avx(auVar4,auVar4,3);
        dVar79 = auVar2._0_8_;
        auVar2 = vshufpd_avx(auVar2,auVar2,3);
        local_230 = dVar95 * auVar2._0_8_ + dVar97 * auVar4._0_8_ + dVar99 * dVar79;
        dStack_228 = dVar96 * auVar2._8_8_ + dVar98 * auVar4._8_8_ + dVar100 * dVar79;
        local_220 = dVar47 * auVar48._0_8_ + dVar11 * auVar61._0_8_ + dVar12 * dVar79;
        auVar61 = vshufpd_avx(auVar3,auVar3,1);
        dVar79 = auVar3._0_8_;
        auVar4 = vshufpd_avx(auVar3,auVar3,3);
        local_218 = dVar97 * dVar79 + dVar99 * auVar4._0_8_ + dVar95 * dVar10;
        dStack_210 = dVar98 * dVar79 + dVar100 * auVar4._8_8_ + dVar96 * dVar10;
        local_208 = dVar10 * dVar47 + dVar11 * dVar79 + dVar12 * auVar61._0_8_;
        local_518 = local_248 * local_950;
        dStack_510 = dStack_240 * dStack_948;
        local_508 = local_238 * local_940;
        local_3b0 = local_248 * local_7e8;
        dStack_3a8 = dStack_240 * dStack_7e0;
        local_3a0 = local_238 * local_7d8;
        local_248 = local_248 * local_680;
        dStack_240 = dStack_240 * dStack_678;
        local_238 = local_238 * local_670;
        local_500 = local_230 * local_938;
        dStack_4f8 = dStack_228 * dStack_930;
        local_4f0 = local_220 * local_928;
        local_398 = local_230 * local_7d0;
        dStack_390 = dStack_228 * dStack_7c8;
        local_388 = local_220 * local_7c0;
        local_230 = local_230 * local_668;
        dStack_228 = dStack_228 * dStack_660;
        local_220 = local_220 * local_658;
        local_4e8 = local_218 * local_920;
        dStack_4e0 = dStack_210 * dStack_918;
        local_4d8 = local_208 * local_910;
        local_380 = local_218 * local_7b8;
        dStack_378 = dStack_210 * dStack_7b0;
        local_370 = local_208 * local_7a8;
        local_218 = local_218 * local_650;
        dStack_210 = dStack_210 * dStack_648;
        local_208 = local_208 * local_640;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar60 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_0072549e;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 8) {
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_e28 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,8,3,1,8,3>>
                    (&local_200,&this->m_SD,(Matrix<double,_45,_3,_0,_45,_3> *)local_638,&local_e28)
          ;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x18) {
            pdVar58 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            if (pdVar58 != (double *)0x0) {
              free((void *)pdVar58[-1]);
            }
            pvVar56 = malloc(0x100);
            if (pvVar56 == (void *)0x0) {
              pdVar58 = (double *)0x0;
            }
            else {
              *(void **)(((ulong)pvVar56 & 0xffffffffffffffc0) + 0x38) = pvVar56;
              pdVar58 = (double *)(((ulong)pvVar56 & 0xffffffffffffffc0) + 0x40);
            }
            if (pdVar58 == (double *)0x0) {
              puVar57 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar57 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar57,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar58;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x18;
          }
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              == 0x18) {
            pdVar58 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            uVar59 = 0xfffffffffffffff8;
            do {
              dVar47 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 9];
              dVar10 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 10];
              dVar95 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 0xb];
              dVar96 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 0xc];
              dVar11 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 0xd];
              dVar12 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 0xe];
              dVar97 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar59 + 0xf];
              pdVar1 = pdVar58 + uVar59 + 8;
              *pdVar1 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                        m_storage.m_data.array[uVar59 + 8];
              pdVar1[1] = dVar47;
              pdVar1[2] = dVar10;
              pdVar1[3] = dVar95;
              pdVar1[4] = dVar96;
              pdVar1[5] = dVar11;
              pdVar1[6] = dVar12;
              pdVar1[7] = dVar97;
              uVar59 = uVar59 + 8;
            } while (uVar59 < 0x10);
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 24, 1>>, T1 = double, T2 = double]"
                       );
        }
        pcVar60 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 8, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 8, 3, 1>]"
        ;
        goto LAB_007254c0;
      }
      pcVar60 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar60 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar60);
  }
LAB_00725400:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
               );
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed. For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 8 in xi, 4 in eta, and 4 in
    // zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and zeta directions for
    // "Full Integration". However, very similar results can be obtained with fewer GQ point in each direction,
    // resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32 ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33 ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31 ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32 ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33 ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency. Since only the diagonal terms in the 6x6 stiffness matrix are
    // used, the 2nd Piola-Kirchoff stress can be calculated by simply scaling the vector of scaled Green-Lagrange
    // strains in Voight notation by the corresponding diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*E11 = D11*kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0.array() *= (0.5 * D0(0)) * m_kGQ_D0.array();

    // Each entry in SPK2_2 = D22*kGQ*E22 = D22*kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0.array() *= (0.5 * D0(1)) * m_kGQ_D0.array();

    // Each entry in SPK2_3 = D33*kGQ_D0*E33 = D33*kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0.array() *= (0.5 * D0(2)) * m_kGQ_D0.array();

    // Each entry in SPK2_4 = D44*kGQ*2*E23 = D44*kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0.array() *= D0(3) * m_kGQ_D0.array();

    // Each entry in SPK2_5 = D55*kGQ*2*E13 = D55*kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0.array() *= D0(4) * m_kGQ_D0.array();

    // Each entry in SPK2_6 = D66*kGQ*2*E12 = D66*(F11*F12+F21*F22+F31*F32)
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0.array() *= D0(5) * m_kGQ_D0.array();

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Blocks entries are calculated in a later step
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The combined result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) again for efficiency. Results are written in Voigt notation: epsilon =
    // [E11,E22,E33,2*E23,2*E13,2*E12] Note that with the material assumption being used, only [E11,E22,E33] need to be
    // calculated
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have already been scaled
    // by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point to make the
    // calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}